

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::printStats(Solver *this)

{
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  rusage ru;
  rusage local_b8;
  
  uVar8 = 0;
  getrusage(RUSAGE_SELF,&local_b8);
  dVar10 = (double)local_b8.ru_utime.tv_usec / 1000000.0 + (double)local_b8.ru_utime.tv_sec;
  dVar9 = memUsedPeak();
  printf("c restarts              : %lu\n",this->starts);
  uVar2 = this->conflicts;
  auVar11._8_4_ = (int)(uVar2 >> 0x20);
  auVar11._0_8_ = uVar2;
  auVar11._12_4_ = 0x45300000;
  printf("c conflicts             : %-12lu   (%.0f /sec)\n",
         ((auVar11._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / dVar10);
  uVar3 = this->decisions;
  auVar19._8_4_ = (int)(uVar3 >> 0x20);
  auVar19._0_8_ = uVar3;
  auVar19._12_4_ = 0x45300000;
  printf("c decisions             : %-12lu   (%4.2f %% random) (%.0f /sec)\n",
         (double)(((float)this->rnd_decisions * 100.0) / (float)uVar3),
         ((auVar19._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) / dVar10);
  uVar2 = this->propagations;
  auVar12._8_4_ = (int)(uVar2 >> 0x20);
  auVar12._0_8_ = uVar2;
  auVar12._12_4_ = 0x45300000;
  printf("c propagations          : %-12lu   (%.0f /sec)\n",
         ((auVar12._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / dVar10);
  uVar2 = this->max_literals;
  lVar6 = (uVar2 - this->tot_literals) * 100;
  auVar20._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar20._0_8_ = lVar6;
  auVar20._12_4_ = 0x45300000;
  auVar13._8_4_ = (int)(uVar2 >> 0x20);
  auVar13._0_8_ = uVar2;
  auVar13._12_4_ = 0x45300000;
  printf("c conflict literals     : %-12lu   (%4.2f %% deleted)\n",
         ((auVar20._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)));
  lVar6 = this->chrono_backtrack + this->non_chrono_backtrack;
  lVar7 = this->non_chrono_backtrack * 100;
  auVar14._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar14._0_8_ = lVar7;
  auVar14._12_4_ = 0x45300000;
  auVar15._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar15._0_8_ = lVar6;
  auVar15._12_4_ = 0x45300000;
  dVar18 = (auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  lVar6 = this->chrono_backtrack * 100;
  auVar21._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar21._0_8_ = lVar6;
  auVar21._12_4_ = 0x45300000;
  printf("c backtracks            : %-12lu   (NCB %0.f%% , CB %0.f%%)\n",
         ((auVar14._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / dVar18,
         ((auVar21._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / dVar18);
  uVar4 = (this->restart).savedPropagations;
  auVar16._8_4_ = (int)(uVar4 >> 0x20);
  auVar16._0_8_ = uVar4;
  auVar16._12_4_ = 0x45300000;
  uVar2 = this->propagations;
  auVar17._8_4_ = (int)(uVar2 >> 0x20);
  auVar17._0_8_ = uVar2;
  auVar17._12_4_ = 0x45300000;
  printf("c partial restarts      : %-12lu   (partial: %lu  savedD: %lu savedP: %lu (%.2lf %%))\n",
         (((auVar16._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) * 100.0) /
         ((auVar17._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)),this->starts,
         (this->restart).partialRestarts,(this->restart).savedDecisions);
  printf("c polarity              : %d pos, %d neg\n",(ulong)this->posMissingInSome,
         (ulong)this->negMissingInSome);
  printf("c LCM                   : %lu runs, %lu Ctried, %lu Cshrinked (%lu known duplicates), %lu Ldeleted, %lu Lrev-deleted\n"
         ,this->nbSimplifyAll,this->LCM_total_tries,this->LCM_successful_tries,
         this->nr_lcm_duplicates,this->LCM_dropped_lits,this->LCM_dropped_reverse);
  printf("c Inprocessing          : %lu subsumed, %lu dropped lits, %lu attempts, %lu mems\n",
         this->inprocessing_C,this->inprocessing_L,this->inprocessings,this->inprocess_mems);
  dVar18 = (this->statistics).solveSeconds;
  uVar2 = (this->statistics).solveSteps;
  uVar4 = (this->statistics).simpSteps;
  uVar1 = (this->vardata).sz;
  if (((this->asynch_interrupt == false) &&
      ((this->conflict_budget < 0 || (this->conflicts < (ulong)this->conflict_budget)))) &&
     ((this->propagation_budget < 0 || (this->propagations < (ulong)this->propagation_budget)))) {
    if (this->termCallback == (_func_int_void_ptr *)0x0) {
      uVar8 = 1;
    }
    else {
      iVar5 = (*this->termCallback)(this->termCallbackState);
      uVar8 = (uint)(iVar5 == 0);
    }
  }
  printf("c Stats:                : %lf solve, %lu steps, %lf simp, %lu steps, %d var, budget: %d\n"
         ,dVar18,uVar2,uVar4,(ulong)uVar1,(ulong)uVar8);
  printf("c backup trail: stored: %lu used successfully: %lu\n",this->backuped_trail_lits,
         this->used_backup_lits);
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    printf("c Memory used           : %.2f MB\n",dVar9);
  }
  printf("c CPU time              : %g s\n",dVar10);
  return;
}

Assistant:

void Solver::printStats()
{
    double cpu_time = cpuTime();
    double mem_used = memUsedPeak();
    printf("c restarts              : %" PRIu64 "\n", starts);
    printf("c conflicts             : %-12" PRIu64 "   (%.0f /sec)\n", conflicts, conflicts / cpu_time);
    printf("c decisions             : %-12" PRIu64 "   (%4.2f %% random) (%.0f /sec)\n", decisions,
           (float)rnd_decisions * 100 / (float)decisions, decisions / cpu_time);
    printf("c propagations          : %-12" PRIu64 "   (%.0f /sec)\n", propagations, propagations / cpu_time);
    printf("c conflict literals     : %-12" PRIu64 "   (%4.2f %% deleted)\n", tot_literals,
           (max_literals - tot_literals) * 100 / (double)max_literals);
    printf("c backtracks            : %-12" PRIu64 "   (NCB %0.f%% , CB %0.f%%)\n", non_chrono_backtrack + chrono_backtrack,
           (non_chrono_backtrack * 100) / (double)(non_chrono_backtrack + chrono_backtrack),
           (chrono_backtrack * 100) / (double)(non_chrono_backtrack + chrono_backtrack));
    printf("c partial restarts      : %-12" PRIu64 "   (partial: %" PRIu64 "  savedD: %" PRIu64 " savedP: %" PRIu64
           " (%.2lf %%))\n",
           starts, restart.partialRestarts, restart.savedDecisions, restart.savedPropagations,
           ((double)restart.savedPropagations * 100.0) / (double)propagations);
    printf("c polarity              : %d pos, %d neg\n", posMissingInSome, negMissingInSome);
    printf("c LCM                   : %lu runs, %lu Ctried, %lu Cshrinked (%lu known duplicates), %lu Ldeleted, %lu "
           "Lrev-deleted\n",
           nbSimplifyAll, LCM_total_tries, LCM_successful_tries, nr_lcm_duplicates, LCM_dropped_lits, LCM_dropped_reverse);
    printf("c Inprocessing          : %lu subsumed, %lu dropped lits, %lu attempts, %lu mems\n", inprocessing_C,
           inprocessing_L, inprocessings, inprocess_mems);
    printf("c Stats:                : %lf solve, %lu steps, %lf simp, %lu steps, %d var, budget: %d\n", statistics.solveSeconds,
           statistics.solveSteps, statistics.simpSeconds, statistics.simpSteps, nVars(), withinBudget());
    printf("c backup trail: stored: %lu used successfully: %lu\n", backuped_trail_lits, used_backup_lits);
    if (mem_used != 0) printf("c Memory used           : %.2f MB\n", mem_used);
    printf("c CPU time              : %g s\n", cpu_time);
}